

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cc
# Opt level: O2

char * Varint::Parse64Fallback(char *p,uint64 *OUTPUT)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uchar *ptr;
  char *pcVar4;
  
  if (-1 < *p) {
    __assert_fail("*ptr >= 128",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/varint.cc"
                  ,0x3f,"static const char *Varint::Parse64Fallback(const char *, uint64 *)");
  }
  uVar1 = (ulong)(byte)*p - 0x80 | (ulong)(byte)p[1] << 7;
  if (p[1] < '\0') {
    uVar1 = uVar1 - 0x4000 | (ulong)(byte)p[2] << 0xe;
    if (p[2] < '\0') {
      uVar1 = (uVar1 + (ulong)(byte)p[3] * 0x200000) - 0x200000;
      if (p[3] < '\0') {
        uVar2 = (ulong)(byte)p[4];
        if (p[4] < '\0') {
          uVar2 = uVar2 - 0x80 | (ulong)(byte)p[5] << 7;
          if (p[5] < '\0') {
            uVar2 = uVar2 - 0x4000 | (ulong)(byte)p[6] << 0xe;
            if (p[6] < '\0') {
              uVar2 = (uVar2 + (ulong)(byte)p[7] * 0x200000) - 0x200000;
              if (p[7] < '\0') {
                uVar3 = (ulong)(byte)p[8];
                if (p[8] < '\0') {
                  if (1 < (byte)p[9]) {
                    return (char *)0x0;
                  }
                  pcVar4 = p + 10;
                  uVar3 = uVar3 - 0x80 | (ulong)(byte)p[9] << 7;
                }
                else {
                  pcVar4 = p + 9;
                }
                uVar1 = uVar1 + (uVar3 << 0x38) + uVar2 * 0x10000000 + 0xfefffffff0000000;
                goto LAB_00269c2c;
              }
              pcVar4 = p + 8;
            }
            else {
              pcVar4 = p + 7;
            }
          }
          else {
            pcVar4 = p + 6;
          }
        }
        else {
          pcVar4 = p + 5;
        }
        uVar1 = (uVar1 + uVar2 * 0x10000000) - 0x10000000;
      }
      else {
        pcVar4 = p + 4;
      }
    }
    else {
      pcVar4 = p + 3;
    }
  }
  else {
    pcVar4 = p + 2;
  }
LAB_00269c2c:
  *OUTPUT = uVar1;
  return pcVar4;
}

Assistant:

const char* Varint::Parse64Fallback(const char* p, uint64* OUTPUT) {
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  assert(*ptr >= 128);
#if defined(__x86_64__)
  // This approach saves one redundant operation on the last byte (masking a
  // byte that doesn't need it). This is conditional on x86 because:
  // - PowerPC has specialized bit instructions that make masking and
  //   shifting very efficient
  // - x86 seems to be one of the few architectures that has a single
  //   instruction to add 3 values.
  //
  // e.g.
  // Input: 0xff, 0x40
  // Mask & Or calculates: (0xff & 0x7f) | ((0x40 & 0x7f) << 7) = 0x207f
  // Sub1 & Add calculates: 0xff         + ((0x40    - 1) << 7) = 0x207f
  //
  // The subtract one removes the bit set by the previous byte used to
  // indicate that more bytes are present. It also has the potential to
  // allow instructions like LEA to combine 2 adds into one instruction.
  //
  // E.g. on an x86 architecture, %rcx = %rax + (%rbx - 1) << 7 could be
  // emitted as:
  //   shlq $7, %rbx
  //   leaq -0x80(%rax, %rbx), %rcx
  //
  // Fast path: need to accumulate data in upto three result fragments
  //    res1    bits 0..27
  //    res2    bits 28..55
  //    res3    bits 56..63

  uint64 byte, res1, res2 = 0, res3 = 0;
  byte = *(ptr++); res1 = byte;
  byte = *(ptr++); res1 += (byte - 1) <<  7; if (byte < 128) goto done1;
  byte = *(ptr++); res1 += (byte - 1) << 14; if (byte < 128) goto done1;
  byte = *(ptr++); res1 += (byte - 1) << 21; if (byte < 128) goto done1;

  byte = *(ptr++); res2 = byte;              if (byte < 128) goto done2;
  byte = *(ptr++); res2 += (byte - 1) <<  7; if (byte < 128) goto done2;
  byte = *(ptr++); res2 += (byte - 1) << 14; if (byte < 128) goto done2;
  byte = *(ptr++); res2 += (byte - 1) << 21; if (byte < 128) goto done2;

  byte = *(ptr++); res3 = byte;              if (byte < 128) goto done3;
  byte = *(ptr++); res3 += (byte - 1) <<  7; if (byte < 2) goto done3;

  return nullptr;       // Value is too long to be a varint64

 done1:
  assert(res2 == 0);
  assert(res3 == 0);
  *OUTPUT = res1;
  return reinterpret_cast<const char*>(ptr);

 done2:
  assert(res3 == 0);
  *OUTPUT = res1 + ((res2 - 1) << 28);
  return reinterpret_cast<const char*>(ptr);

 done3:
  *OUTPUT = res1 + ((res2 - 1) << 28) + ((res3 - 1) << 56);
  return reinterpret_cast<const char*>(ptr);
#else
  uint32 byte, res1, res2=0, res3=0;
  byte = *(ptr++); res1 = byte & 127;
  byte = *(ptr++); res1 |= (byte & 127) <<  7; if (byte < 128) goto done1;
  byte = *(ptr++); res1 |= (byte & 127) << 14; if (byte < 128) goto done1;
  byte = *(ptr++); res1 |= (byte & 127) << 21; if (byte < 128) goto done1;

  byte = *(ptr++); res2 = byte & 127;          if (byte < 128) goto done2;
  byte = *(ptr++); res2 |= (byte & 127) <<  7; if (byte < 128) goto done2;
  byte = *(ptr++); res2 |= (byte & 127) << 14; if (byte < 128) goto done2;
  byte = *(ptr++); res2 |= (byte & 127) << 21; if (byte < 128) goto done2;

  byte = *(ptr++); res3 = byte & 127;          if (byte < 128) goto done3;
  byte = *(ptr++); res3 |= (byte & 127) <<  7; if (byte < 2) goto done3;

  return nullptr;       // Value is too long to be a varint64

 done1:
  assert(res2 == 0);
  assert(res3 == 0);
  *OUTPUT = res1;
  return reinterpret_cast<const char*>(ptr);

 done2:
  assert(res3 == 0);
  *OUTPUT = res1 | (uint64(res2) << 28);
  return reinterpret_cast<const char*>(ptr);

 done3:
  *OUTPUT = res1 | (uint64(res2) << 28) | (uint64(res3) << 56);
  return reinterpret_cast<const char*>(ptr);
#endif
}